

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void simple_light(void)

{
  shared_ptr<diffuse_light> difflight;
  shared_ptr<noise_texture> pertext;
  undefined1 local_298 [20];
  undefined4 uStack_284;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  undefined8 local_278;
  int local_268 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  vec3 local_258;
  hittable_list local_238;
  undefined1 local_1e8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  shared_ptr<hittable> local_1c8;
  shared_ptr<hittable> local_1b8;
  shared_ptr<hittable> local_1a8;
  undefined1 local_198 [16];
  double local_188;
  double local_180;
  double dStack_178;
  double local_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  double local_138;
  double dStack_130;
  double local_128;
  double local_120;
  double dStack_118;
  double local_110;
  undefined1 local_f8 [224];
  
  local_238.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001253d8;
  local_238.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.bbox.x.min = INFINITY;
  local_238.bbox.x.max = -INFINITY;
  local_238.bbox.y.min = INFINITY;
  local_238.bbox.y.max = -INFINITY;
  local_238.bbox.z.min = INFINITY;
  local_238.bbox.z.max = -INFINITY;
  local_198._0_4_ = 4;
  std::make_shared<noise_texture,int>(local_268);
  local_198._0_8_ = 0.0;
  local_198._8_8_ = -1000.0;
  local_188 = 0.0;
  local_298._0_4_ = 1000;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)(local_298 + 0x10));
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            (&local_258,(int *)local_198,(shared_ptr<lambertian> *)local_298);
  local_1a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_1a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  hittable_list::add(&local_238,&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  local_198._0_8_ = 0.0;
  local_198._8_8_ = 2.0;
  local_188 = 0.0;
  local_298._0_4_ = 2;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)(local_298 + 0x10));
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            (&local_258,(int *)local_198,(shared_ptr<lambertian> *)local_298);
  local_1b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_1b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  hittable_list::add(&local_238,&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  local_198._0_8_ = 4.0;
  local_198._8_8_ = 4.0;
  local_188 = 4.0;
  std::make_shared<diffuse_light,vec3>((vec3 *)local_298);
  local_198._0_8_ = 0.0;
  local_198._8_8_ = 7.0;
  local_188 = 0.0;
  local_298._16_4_ = 2;
  std::make_shared<sphere,vec3,int,std::shared_ptr<diffuse_light>&>
            (&local_258,(int *)local_198,(shared_ptr<diffuse_light> *)(local_298 + 0x10));
  local_1c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_1c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  hittable_list::add(&local_238,&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  local_198._0_8_ = 3.0;
  local_198._8_8_ = 1.0;
  local_188 = -2.0;
  local_258.e[0] = 2.0;
  local_258.e[1] = 0.0;
  local_258.e[2] = 0.0;
  local_298._16_4_ = 0;
  uStack_284 = 0;
  _Stack_280._M_pi._0_4_ = 0;
  _Stack_280._M_pi._4_4_ = 0x40000000;
  local_278 = 0;
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<diffuse_light>&>
            ((vec3 *)local_1e8,(vec3 *)local_198,&local_258,
             (shared_ptr<diffuse_light> *)(local_298 + 0x10));
  local_1e8._16_8_ = local_1e8._0_8_;
  _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_;
  local_1e8._0_8_ = 0.0;
  local_1e8._8_8_ = 0.0;
  hittable_list::add(&local_238,(shared_ptr<hittable> *)(local_1e8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
  local_110 = 10.0;
  memset(local_f8,0,0xd8);
  local_198._0_8_ = 1.7777777777777777;
  local_198._8_8_ = 2.12199579294153e-312;
  local_188 = (double)CONCAT44(local_188._4_4_,0x32);
  local_180 = 0.0;
  dStack_178 = 0.0;
  local_170 = 0.0;
  local_168 = 20.0;
  dStack_160 = 26.0;
  local_158 = 3.0;
  dStack_150 = 6.0;
  local_148 = 0;
  uStack_144 = 0;
  uStack_140 = 0;
  uStack_13c = 0x40000000;
  local_138 = 0.0;
  dStack_130 = 0.0;
  local_128 = 1.0;
  local_120 = 0.0;
  dStack_118 = 0.0;
  camera::render((camera *)local_198,&local_238.super_hittable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260);
  hittable_list::~hittable_list(&local_238);
  return;
}

Assistant:

void bouncing_spheres() {
    hittable_list world;

    auto checker = make_shared<checker_texture>(0.32, color(.2, .3, .1), color(.9, .9, .9));
    world.add(make_shared<sphere>(point3(0,-1000,0), 1000, make_shared<lambertian>(checker)));

    for (int a = -11; a < 11; a++) {
        for (int b = -11; b < 11; b++) {
            auto choose_mat = random_double();
            point3 center(a + 0.9*random_double(), 0.2, b + 0.9*random_double());

            if ((center - point3(4, 0.2, 0)).length() > 0.9) {
                shared_ptr<material> sphere_material;

                if (choose_mat < 0.8) {
                    // diffuse
                    auto albedo = color::random() * color::random();
                    sphere_material = make_shared<lambertian>(albedo);
                    auto center2 = center + vec3(0, random_double(0,.5), 0);
                    world.add(make_shared<sphere>(center, center2, 0.2, sphere_material));
                } else if (choose_mat < 0.95) {
                    // metal
                    auto albedo = color::random(0.5, 1);
                    auto fuzz = random_double(0, 0.5);
                    sphere_material = make_shared<metal>(albedo, fuzz);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                } else {
                    // glass
                    sphere_material = make_shared<dielectric>(1.5);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                }
            }
        }
    }

    auto material1 = make_shared<dielectric>(1.5);
    world.add(make_shared<sphere>(point3(0, 1, 0), 1.0, material1));

    auto material2 = make_shared<lambertian>(color(0.4, 0.2, 0.1));
    world.add(make_shared<sphere>(point3(-4, 1, 0), 1.0, material2));

    auto material3 = make_shared<metal>(color(0.7, 0.6, 0.5), 0.0);
    world.add(make_shared<sphere>(point3(4, 1, 0), 1.0, material3));

    world = hittable_list(make_shared<bvh_node>(world));

    camera cam;

    cam.aspect_ratio      = 16.0 / 9.0;
    cam.image_width       = 400;
    cam.samples_per_pixel = 100;
    cam.max_depth         = 50;
    cam.background        = color(0.70, 0.80, 1.00);

    cam.vfov     = 20;
    cam.lookfrom = point3(13,2,3);
    cam.lookat   = point3(0,0,0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0.6;
    cam.focus_dist    = 10.0;

    cam.render(world);
}